

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O2

void __thiscall Sampling_Normal_Test::TestBody(Sampling_Normal_Test *this)

{
  float fVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  undefined1 auVar4 [16];
  float *pfVar5;
  size_t sVar6;
  Allocator AVar7;
  long lVar8;
  char *pcVar9;
  char *in_R9;
  undefined1 auVar10 [16];
  Float FVar11;
  Float FVar12;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  span<const_float> f;
  float local_180;
  undefined4 uStack_17c;
  Float sigma;
  Float mu;
  AssertionResult gtest_ar_;
  Float dp;
  Float local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  Float local_13c;
  AssertionResult gtest_ar;
  AssertHelper local_110;
  Uniform1DIter __begin2;
  _Any_data local_f0;
  code *local_e0;
  code *local_d8;
  IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> local_d0 [2];
  undefined8 local_c8;
  undefined8 local_c0;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> values;
  Uniform1DIter __end2;
  PiecewiseConstant1D distrib;
  undefined1 extraout_var [60];
  
  lVar8 = 0;
  while( true ) {
    if (lVar8 == 0x20) break;
    mu = *(Float *)((long)&DAT_0052d880 + lVar8);
    sigma = *(Float *)((long)&DAT_0052d884 + lVar8);
    local_f0._M_unused._M_object = &sigma;
    local_f0._8_8_ = &mu;
    local_d8 = std::
               _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp:882:23)>
               ::_M_invoke;
    local_e0 = std::
               _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp:882:23)>
               ::_M_manager;
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)mu),ZEXT416((uint)sigma),SUB6416(ZEXT464(0xc0e00000),0))
    ;
    auVar2 = vfmadd231ss_fma(ZEXT416((uint)mu),ZEXT416((uint)sigma),SUB6416(ZEXT464(0x40e00000),0));
    local_158 = auVar10._0_4_;
    AVar7.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::Sample1DFunction
              (&values,(function<float_(float)> *)&local_f0,0x2000,0x10,local_158,auVar2._0_4_,AVar7
              );
    std::_Function_base::~_Function_base((_Function_base *)&local_f0);
    sVar6 = values.nStored;
    pfVar5 = values.ptr;
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)mu),ZEXT416((uint)sigma),ZEXT416(0xc0e00000));
    auVar2 = vfmadd231ss_fma(ZEXT416((uint)mu),ZEXT416((uint)sigma),ZEXT416(0x40e00000));
    local_158 = auVar2._0_4_;
    AVar7.memoryResource = pstd::pmr::new_delete_resource();
    f.n = sVar6;
    f.ptr = pfVar5;
    pbrt::PiecewiseConstant1D::PiecewiseConstant1D(&distrib,f,auVar10._0_4_,local_158,AVar7);
    local_d0[0].n = 100;
    local_c8 = 0;
    local_c0 = 0x853c49e6748fea9b;
    pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::begin
              (&__begin2,local_d0);
    pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::end
              (&__end2,local_d0);
    for (; __begin2.super_RNGIterator<pbrt::detail::Uniform1DIter>.
           super_IndexingIterator<pbrt::detail::Uniform1DIter>.i !=
           __end2.super_RNGIterator<pbrt::detail::Uniform1DIter>.
           super_IndexingIterator<pbrt::detail::Uniform1DIter>.i;
        __begin2.super_RNGIterator<pbrt::detail::Uniform1DIter>.
        super_IndexingIterator<pbrt::detail::Uniform1DIter>.i =
             __begin2.super_RNGIterator<pbrt::detail::Uniform1DIter>.
             super_IndexingIterator<pbrt::detail::Uniform1DIter>.i + 1) {
      local_158 = pbrt::RNG::Uniform<float>
                            (&__begin2.super_RNGIterator<pbrt::detail::Uniform1DIter>.rng);
      uStack_154 = extraout_XMM0_Db;
      uStack_150 = extraout_XMM0_Dc;
      uStack_14c = extraout_XMM0_Dd;
      FVar11 = pbrt::SampleNormal(local_158,mu,sigma);
      FVar12 = pbrt::Gaussian(FVar11,mu,sigma);
      local_13c = pbrt::PiecewiseConstant1D::Sample(&distrib,local_158,&dp,(int *)0x0);
      gtest_ar_.success_ = true;
      gtest_ar_._1_7_ = 0x3f689374bc6a7e;
      auVar10._8_4_ = 0x7fffffff;
      auVar10._0_8_ = 0x7fffffff7fffffff;
      auVar10._12_4_ = 0x7fffffff;
      auVar10 = vandps_avx512vl(ZEXT416((uint)(FVar11 - local_13c)),auVar10);
      local_180 = auVar10._0_4_;
      testing::internal::CmpHelperLT<float,double>
                ((internal *)&gtest_ar,"std::abs(cx - dx)","3e-3",&local_180,(double *)&gtest_ar_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),"Closed form = ");
        std::ostream::operator<<((void *)(gtest_ar_._0_8_ + 0x10),FVar11);
        std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),", distrib = ");
        std::ostream::operator<<((void *)(gtest_ar_._0_8_ + 0x10),local_13c);
        pcVar9 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_180,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                   ,0x37f,pcVar9);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_180,(Message *)&gtest_ar_)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_180);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      gtest_ar_.success_ = true;
      gtest_ar_._1_7_ = 0x3f999999999999;
      auVar2._8_4_ = 0x7fffffff;
      auVar2._0_8_ = 0x7fffffff7fffffff;
      auVar2._12_4_ = 0x7fffffff;
      auVar10 = vandps_avx512vl(ZEXT416((uint)(FVar12 - dp)),auVar2);
      local_180 = auVar10._0_4_ / dp;
      testing::internal::CmpHelperLT<float,double>
                ((internal *)&gtest_ar,"std::abs(cp - dp) / dp",".025",&local_180,
                 (double *)&gtest_ar_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),"Closed form PDF = ");
        std::ostream::operator<<((void *)(gtest_ar_._0_8_ + 0x10),FVar12);
        std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),", distrib PDF = ");
        std::ostream::operator<<((void *)(gtest_ar_._0_8_ + 0x10),dp);
        pcVar9 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_180,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                   ,0x381,pcVar9);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_180,(Message *)&gtest_ar_)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_180);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      auVar13._0_4_ = pbrt::InvertNormalSample(FVar11,mu,sigma);
      auVar13._4_60_ = extraout_var;
      auVar14._8_4_ = 0x7fffffff;
      auVar14._0_8_ = 0x7fffffff7fffffff;
      auVar14._12_4_ = 0x7fffffff;
      auVar4._4_4_ = uStack_154;
      auVar4._0_4_ = local_158;
      auVar4._8_4_ = uStack_150;
      auVar4._12_4_ = uStack_14c;
      auVar10 = vandps_avx(auVar4,auVar14);
      auVar2 = vandps_avx(auVar13._0_16_,auVar14);
      auVar10 = vminss_avx(auVar2,auVar10);
      fVar1 = local_158 - auVar13._0_4_;
      bVar3 = auVar10._0_4_ < 0.01;
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      auVar10 = vandps_avx(ZEXT416((uint)bVar3 * (int)fVar1 +
                                   (uint)!bVar3 *
                                   (int)((fVar1 + fVar1) / (local_158 + auVar13._0_4_))),auVar14);
      gtest_ar_.success_ = auVar10._0_4_ <= 0.01;
      if (0.01 < auVar10._0_4_) {
        testing::Message::Message((Message *)&local_180);
        std::operator<<((ostream *)(CONCAT44(uStack_17c,local_180) + 0x10)," u ");
        std::ostream::operator<<((void *)(CONCAT44(uStack_17c,local_180) + 0x10),local_158);
        std::operator<<((ostream *)(CONCAT44(uStack_17c,local_180) + 0x10)," -> x = ");
        std::ostream::operator<<((void *)(CONCAT44(uStack_17c,local_180) + 0x10),FVar11);
        std::operator<<((ostream *)(CONCAT44(uStack_17c,local_180) + 0x10)," -> ");
        FVar11 = pbrt::InvertNormalSample(FVar11,mu,sigma);
        std::ostream::operator<<((void *)(CONCAT44(uStack_17c,local_180) + 0x10),FVar11);
        std::operator<<((ostream *)(CONCAT44(uStack_17c,local_180) + 0x10)," with mu ");
        std::ostream::operator<<((void *)(CONCAT44(uStack_17c,local_180) + 0x10),mu);
        std::operator<<((ostream *)(CONCAT44(uStack_17c,local_180) + 0x10)," and sigma ");
        std::ostream::operator<<((void *)(CONCAT44(uStack_17c,local_180) + 0x10),sigma);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)"checkErr(u, InvertNormalSample(cx, mu, sigma))","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_110,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                   ,0x38c,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_180);
        testing::internal::AssertHelper::~AssertHelper(&local_110);
        std::__cxx11::string::~string((string *)&gtest_ar);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_180);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
    }
    pbrt::PiecewiseConstant1D::~PiecewiseConstant1D(&distrib);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&values);
    lVar8 = lVar8 + 8;
  }
  return;
}

Assistant:

TEST(Sampling, Normal) {
    Float params[][2] = {{0., 1.}, {-.5, .8}, {.25, .005}, {3.6, 1.6}};
    for (const auto p : params) {
        Float mu = p[0], sigma = p[1];
        auto normal = [&](Float x) {
            return 1 / std::sqrt(2 * Pi * sigma * sigma) *
                   std::exp(-Sqr(x - mu) / (2 * sigma * sigma));
        };
        auto values = Sample1DFunction(normal, 8192, 16, mu - 7 * sigma, mu + 7 * sigma);
        PiecewiseConstant1D distrib(values, mu - 7 * sigma, mu + 7 * sigma);

        for (Float u : Uniform1D(100)) {
            Float cx = SampleNormal(u, mu, sigma);
            Float cp = NormalPDF(cx, mu, sigma);

            Float dp;
            Float dx = distrib.Sample(u, &dp);
            EXPECT_LT(std::abs(cx - dx), 3e-3)
                << "Closed form = " << cx << ", distrib = " << dx;
            EXPECT_LT(std::abs(cp - dp) / dp, .025)
                << "Closed form PDF = " << cp << ", distrib PDF = " << dp;

            auto checkErr = [](Float a, Float b) {
                Float err;
                if (std::min(std::abs(a), std::abs(b)) < 1e-2)
                    err = std::abs(a - b);
                else
                    err = std::abs(2 * (a - b) / (a + b));
                return err > 1e-2;
            };
            EXPECT_FALSE(checkErr(u, InvertNormalSample(cx, mu, sigma)))
                << " u " << u << " -> x = " << cx << " -> "
                << InvertNormalSample(cx, mu, sigma) << " with mu " << mu << " and sigma "
                << sigma;
        }
    }
}